

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O1

int Maj_ManExactSynthesis2
              (int nVars,int nNodes,int fUseConst,int fUseLine,int fUseRand,int nRands,int fVerbose)

{
  ulong *puVar1;
  Vec_Wec_t *p;
  word wVar2;
  lit *begin;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint *__ptr;
  uint *puVar10;
  void *pvVar11;
  clock_t cVar12;
  ulong uVar13;
  int *piVar14;
  sat_solver *s;
  uint uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  void *pvVar19;
  long *end;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  char *pcVar25;
  long lVar26;
  uint *puVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  uint *puVar31;
  timespec *begin_00;
  uint *puVar32;
  bool bVar33;
  byte bVar34;
  int iMint;
  timespec ts;
  long local_228;
  uint local_214;
  uint *local_210;
  ulong local_208;
  uint local_200;
  uint local_1fc;
  ulong local_1f8;
  uint *local_1f0;
  uint *local_1e8;
  uint local_1dc;
  long local_1d8;
  long local_1d0;
  ulong local_1c8;
  uint *local_1c0;
  timespec local_1b8;
  long local_1a8;
  
  local_214 = 0;
  iVar3 = clock_gettime(3,&local_1b8);
  if (iVar3 < 0) {
    local_1d8 = 1;
  }
  else {
    lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_1b8.tv_nsec._4_4_,(uint)local_1b8.tv_nsec)),8);
    local_1d8 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) +
                CONCAT44(local_1b8.tv_sec._4_4_,(int)local_1b8.tv_sec) * -1000000;
  }
  __ptr = (uint *)calloc(1,0x30c8);
  *__ptr = nVars;
  __ptr[1] = nNodes;
  uVar21 = nVars + nNodes + 2;
  __ptr[2] = uVar21;
  __ptr[5] = fUseConst;
  __ptr[6] = fUseLine;
  __ptr[7] = fUseRand;
  __ptr[9] = fVerbose;
  __ptr[8] = nRands;
  uVar17 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar17 = 1;
  }
  __ptr[3] = uVar17;
  puVar10 = (uint *)malloc(0x10);
  uVar15 = nVars + nNodes + 1;
  uVar17 = 8;
  if (6 < uVar15) {
    uVar17 = uVar21;
  }
  puVar10[1] = 0;
  *puVar10 = uVar17;
  if (uVar17 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = calloc((long)(int)uVar17,0x10);
  }
  *(void **)(puVar10 + 2) = pvVar11;
  puVar10[1] = uVar21;
  *(uint **)(__ptr + 0xc2e) = puVar10;
  memset(&local_1b8,0,0x180);
  __ptr[4] = 1;
  if (0x20 < (int)uVar21) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0xa1,"int Maj_ManMarkup(Maj_Man_t *)");
  }
  if (fUseRand != 0) {
    iVar3 = nVars + 2;
    cVar12 = clock();
    srand((uint)cVar12);
    uVar17 = nNodes + nVars;
    if (iVar3 <= (int)uVar17) {
LAB_005a4b5b:
      do {
        iVar4 = rand();
        iVar4 = iVar4 % (int)(~uVar17 + uVar21) + uVar17 + 1;
        uVar5 = 2;
        do {
          if (*(int *)((long)&local_1b8.tv_sec + (ulong)uVar5 * 4 + (long)iVar4 * 0xc) == 0) {
            *(uint *)((long)&local_1b8.tv_sec + (ulong)uVar5 * 4 + (long)iVar4 * 0xc) = uVar17;
            if (fVerbose != 0) {
              printf("%d -> %d  ",(ulong)uVar17);
            }
            bVar33 = iVar3 < (int)uVar17;
            uVar17 = uVar17 - 1;
            if (bVar33) goto LAB_005a4b5b;
            goto LAB_005a4bc8;
          }
          bVar33 = uVar5 != 0;
          uVar5 = uVar5 - 1;
        } while (bVar33);
      } while( true );
    }
LAB_005a4bc8:
    if (0 < nRands) {
      iVar4 = 0;
      do {
        iVar6 = rand();
        iVar6 = iVar6 % (int)(uVar15 - iVar3);
        uVar17 = iVar6 + iVar3;
        iVar22 = 0;
        do {
          iVar7 = rand();
          iVar7 = iVar7 % (int)(uVar15 - uVar17) + iVar6 + iVar3 + 1;
          uVar29 = 2;
          while( true ) {
            iVar28 = (int)uVar29;
            uVar21 = *(uint *)((long)&local_1b8.tv_sec + uVar29 * 4 + (long)iVar7 * 0xc);
            iVar8 = -1;
            if (uVar21 == uVar17) break;
            if (uVar21 == 0) {
              *(uint *)((long)&local_1b8.tv_sec + uVar29 * 4 + (long)iVar7 * 0xc) = uVar17;
              iVar8 = iVar28;
              if (fVerbose != 0) {
                printf("+%d -> %d  ",(ulong)uVar17);
              }
              break;
            }
            uVar29 = (ulong)(iVar28 - 1);
            if (iVar28 == 0) break;
          }
          if (-1 < iVar8) goto LAB_005a4c79;
          iVar22 = iVar22 + 1;
        } while (iVar22 != 100);
        iVar22 = 100;
LAB_005a4c79:
        iVar4 = (iVar4 - (uint)(iVar22 == 100)) + 1;
      } while (iVar4 < nRands);
    }
    if (fVerbose != 0) {
      putchar(10);
    }
  }
  local_1e8 = __ptr + 0xc;
  puVar10 = __ptr + (long)(int)(*__ptr + 2) * 0x60 + 0x10;
  lVar18 = 4;
  do {
    if ((int)__ptr[4] < 0) {
LAB_005a602f:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    p = *(Vec_Wec_t **)(__ptr + 0xc2e);
    Vec_WecPush(p,(int)lVar18,__ptr[4] * 2);
    uVar17 = __ptr[4];
    __ptr[4] = uVar17 + 1;
    *puVar10 = uVar17;
    lVar18 = lVar18 + -1;
    puVar10 = puVar10 + 0x1f;
  } while (lVar18 != 1);
  uVar17 = *__ptr;
  if ((int)(uVar17 + 3) < (int)__ptr[2]) {
    lVar18 = (long)(int)uVar17 + 3;
    puVar10 = __ptr + (long)(int)uVar17 * 0x60 + 300;
    do {
      puVar27 = local_1e8;
      local_208 = lVar18 * 0x180;
      lVar23 = 0;
      local_210 = puVar10;
      do {
        if ((lVar23 == 0) && (__ptr[6] != 0)) {
          uVar17 = __ptr[4];
          if ((int)uVar17 < 0) goto LAB_005a602f;
          Vec_WecPush(p,(int)lVar18 + -1,uVar17 * 2);
          __ptr[4] = uVar17 + 1;
          puVar27[lVar18 * 0x61 + -1] = uVar17;
        }
        else {
          if (__ptr[7] != 0) {
            iVar3 = *(int *)((long)&local_1b8.tv_sec + lVar23 * 4 + lVar18 * 0xc);
            if (0 < (long)iVar3) {
              uVar17 = __ptr[4];
              if (-1 < (int)uVar17) {
                Vec_WecPush(p,iVar3,uVar17 * 2);
                __ptr[4] = uVar17 + 1;
                *(uint *)((long)local_1e8 + (long)iVar3 * 4 + local_208 + lVar23 * 0x80) = uVar17;
                goto LAB_005a4e15;
              }
              goto LAB_005a602f;
            }
          }
          uVar29 = (ulong)((uint)(__ptr[5] == 0) * 2);
          if (lVar23 != 2) {
            uVar29 = 2;
          }
          while( true ) {
            iVar3 = (int)lVar18;
            if (__ptr[7] != 0) {
              iVar3 = *__ptr + 2;
            }
            if ((long)(iVar3 - (int)lVar23) <= (long)uVar29) break;
            uVar17 = __ptr[4];
            if ((int)uVar17 < 0) goto LAB_005a602f;
            Vec_WecPush(p,(int)uVar29,uVar17 * 2);
            __ptr[4] = uVar17 + 1;
            puVar10[uVar29] = uVar17;
            uVar29 = uVar29 + 1;
          }
        }
LAB_005a4e15:
        lVar23 = lVar23 + 1;
        puVar10 = puVar10 + 0x20;
      } while (lVar23 != 3);
      lVar18 = lVar18 + 1;
      puVar10 = local_210 + 0x60;
    } while (lVar18 < (int)__ptr[2]);
  }
  printf("The number of parameter variables = %d.\n");
  if (__ptr[9] != 0) {
    printf("     ");
    uVar17 = *__ptr;
    uVar5 = uVar17 + 2;
    uVar21 = __ptr[2];
    uVar29 = (ulong)uVar21;
    uVar15 = uVar5;
    if ((int)uVar5 < (int)uVar21) {
      do {
        printf("   Node %2d    ");
        uVar15 = uVar15 + 1;
      } while (uVar21 != uVar15);
    }
    putchar(10);
    if (0 < (int)uVar21) {
      local_208 = (long)(int)uVar17 + 2;
      local_210 = __ptr + (long)(int)uVar17 * 0x60 + 0xcc;
      uVar20 = 0;
      do {
        printf("%2d : ");
        uVar13 = local_208;
        puVar10 = local_210;
        if ((int)uVar5 < (int)uVar21) {
          do {
            uVar30 = 0;
            puVar27 = puVar10;
            do {
              if (uVar30 == uVar20) {
                lVar18 = 0;
                do {
                  if (*(int *)((long)puVar27 + lVar18) == 0) {
                    pcVar25 = "%3c ";
                  }
                  else {
                    pcVar25 = "%3d ";
                  }
                  printf(pcVar25);
                  lVar18 = lVar18 + 0x80;
                } while (lVar18 != 0x180);
                printf("  ");
              }
              uVar30 = uVar30 + 1;
              puVar27 = puVar27 + 1;
            } while (uVar30 != uVar29);
            uVar13 = uVar13 + 1;
            puVar10 = puVar10 + 0x60;
          } while (uVar13 != uVar29);
        }
        putchar(10);
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar29);
    }
  }
  __ptr[0xc0d] = 1;
  uVar17 = __ptr[2];
  uVar21 = __ptr[3];
  uVar29 = (ulong)uVar21;
  iVar4 = (uVar17 + 1) * uVar21;
  piVar14 = (int *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar3 = iVar4;
  }
  piVar14[1] = 0;
  *piVar14 = iVar3;
  if (iVar3 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = malloc((long)iVar3 << 3);
  }
  *(void **)(piVar14 + 2) = pvVar11;
  piVar14[1] = iVar4;
  memset(pvVar11,0,(long)iVar4 << 3);
  *(int **)(__ptr + 10) = piVar14;
  uVar15 = *__ptr;
  uVar9 = 1 << ((byte)uVar15 & 0x1f);
  uVar5 = 0x40;
  if (0x40 < (int)uVar9) {
    uVar5 = uVar9;
  }
  if (((int)uVar21 < 0) || (iVar4 <= (int)uVar21)) {
LAB_005a606d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                  ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  if (0 < (int)uVar21) {
    memset((void *)((long)pvVar11 + uVar29 * 8),0xff,uVar29 * 8);
  }
  if (0 < (int)uVar15) {
    uVar20 = (ulong)(uint)(1 << ((byte)uVar15 - 6 & 0x1f));
    if ((int)uVar15 < 7) {
      uVar20 = 1;
    }
    pvVar19 = (void *)(uVar29 * 0x10 + (long)pvVar11);
    uVar13 = 0;
    do {
      iVar3 = ((int)uVar13 + 2) * uVar21;
      if ((iVar3 < 0) || (iVar4 <= iVar3)) goto LAB_005a606d;
      if (uVar13 < 6) {
        if (0 < (int)uVar20) {
          wVar2 = s_Truths6[uVar13];
          uVar30 = 0;
          do {
            *(word *)((long)pvVar19 + uVar30 * 8) = wVar2;
            uVar30 = uVar30 + 1;
          } while (uVar20 != uVar30);
        }
      }
      else if (0 < (int)uVar20) {
        uVar30 = 0;
        do {
          *(ulong *)((long)pvVar19 + uVar30 * 8) =
               -(ulong)((1 << ((char)uVar13 - 6U & 0x1f) & (uint)uVar30) != 0);
          uVar30 = uVar30 + 1;
        } while (uVar20 != uVar30);
      }
      uVar13 = uVar13 + 1;
      pvVar19 = (void *)((long)pvVar19 + uVar29 * 8);
    } while (uVar13 != uVar15);
  }
  uVar17 = uVar17 * uVar21;
  uVar21 = 0;
  do {
    iVar3 = 0;
    if (0 < (int)uVar15) {
      iVar3 = 0;
      uVar9 = 0;
      do {
        iVar3 = iVar3 + (uint)((uVar21 >> (uVar9 & 0x1f) & 1) != 0);
        uVar9 = uVar9 + 1;
      } while (uVar15 != uVar9);
    }
    if ((int)uVar15 / 2 < iVar3) {
      if (iVar4 <= (int)uVar17 || (int)uVar17 < 0) goto LAB_005a606d;
      puVar1 = (ulong *)((long)pvVar11 + (ulong)(uVar21 >> 6) * 8 + (ulong)uVar17 * 8);
      *puVar1 = *puVar1 | 1L << ((byte)uVar21 & 0x3f);
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != uVar5);
  *(int **)(__ptr + 10) = piVar14;
  s = sat_solver_new();
  *(sat_solver **)(__ptr + 0xc30) = s;
  sat_solver_setnvars(s,__ptr[4]);
  lVar18 = (long)(int)*__ptr;
  if ((int)(*__ptr + 2) < (int)__ptr[2]) {
    local_208 = lVar18 + 2;
    puVar10 = __ptr + lVar18 * 0x60 + 0xcc;
    puVar27 = __ptr + lVar18 * 0x60 + 0xec;
LAB_005a5267:
    lVar18 = 0;
    puVar31 = puVar27;
    local_1f0 = puVar10;
LAB_005a5277:
    begin_00 = &local_1b8;
    uVar17 = __ptr[2];
    if ((long)(int)uVar17 < 1) {
      uVar21 = 0;
    }
    else {
      lVar23 = 0;
      uVar21 = 0;
      do {
        uVar15 = puVar10[lVar23];
        if (uVar15 != 0) {
          if ((int)uVar15 < 0) goto LAB_005a602f;
          lVar26 = (long)(int)uVar21;
          uVar21 = uVar21 + 1;
          *(uint *)((long)&local_1b8.tv_sec + lVar26 * 4) = uVar15 * 2;
        }
        lVar23 = lVar23 + 1;
      } while ((int)uVar17 != lVar23);
    }
    if ((int)uVar21 < 1) {
      __assert_fail("nLits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                    ,0x177,"int Maj_ManAddCnfStart(Maj_Man_t *)");
    }
    uVar29 = (ulong)uVar21;
    iVar3 = sat_solver_addclause
                      (*(sat_solver **)(__ptr + 0xc30),(lit *)begin_00,
                       (lit *)((long)&local_1b8.tv_sec + uVar29 * 4));
    if (iVar3 == 0) {
      iVar3 = 1;
    }
    else {
      uVar20 = 0;
      uVar13 = uVar29;
      do {
        uVar30 = uVar20 + 1;
        if (uVar30 < uVar29) {
          uVar24 = 1;
          do {
            uVar17 = *(uint *)((long)&local_1b8.tv_sec + uVar20 * 4);
            if ((int)uVar17 < 0) {
LAB_005a6010:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            local_200 = uVar17 ^ 1;
            uVar17 = *(uint *)((long)&begin_00->tv_sec + uVar24 * 4);
            if ((int)uVar17 < 0) goto LAB_005a6010;
            local_1fc = uVar17 ^ 1;
            iVar3 = sat_solver_addclause
                              (*(sat_solver **)(__ptr + 0xc30),(lit *)&local_200,(lit *)&local_1f8);
            if (iVar3 == 0) goto LAB_005a53a5;
            uVar24 = uVar24 + 1;
          } while (uVar13 != uVar24);
        }
        uVar13 = uVar13 - 1;
        begin_00 = (timespec *)((long)&begin_00->tv_sec + 4);
        uVar20 = uVar30;
      } while (uVar30 != uVar29);
      iVar3 = 7;
      if (lVar18 != 2) {
        local_210 = (uint *)(local_208 * 0x180);
        if ((((local_1e8 + local_208 * 0x60)[lVar18 * 0x20 + 2] != 0) &&
            ((local_1e8 + local_208 * 0x60)[lVar18 * 0x20 + 0x22] != 0)) &&
           (iVar3 = 0, 0 < (int)__ptr[2])) {
          lVar23 = 0;
          puVar32 = puVar31;
          local_1f8 = lVar18 * 0x80;
          do {
            if ((*(int *)((long)local_210 + (long)local_1e8 + lVar23 * 4 + local_1f8) != 0) &&
               (lVar23 < (int)__ptr[2])) {
              piVar14 = (int *)((long)local_210 + (long)local_1e8 + lVar23 * 4 + local_1f8);
              lVar26 = 0;
              do {
                uVar17 = puVar32[lVar26];
                if (uVar17 != 0) {
                  iVar3 = *piVar14;
                  if ((iVar3 < 0) || (local_200 = iVar3 * 2 + 1, (int)uVar17 < 0))
                  goto LAB_005a602f;
                  local_1fc = uVar17 * 2 + 1;
                  iVar3 = sat_solver_addclause
                                    (*(sat_solver **)(__ptr + 0xc30),(lit *)&local_200,
                                     (lit *)&local_1f8);
                  if (iVar3 == 0) goto LAB_005a53a5;
                }
                lVar26 = lVar26 + 1;
              } while ((int)lVar26 + (int)lVar23 < (int)__ptr[2]);
            }
            lVar23 = lVar23 + 1;
            puVar32 = puVar32 + 1;
          } while (lVar23 < (int)__ptr[2]);
          iVar3 = 0;
        }
      }
    }
    goto LAB_005a53bb;
  }
LAB_005a551d:
  if (3 < (int)__ptr[2]) {
    lVar18 = 2;
    lVar23 = 0x28;
    do {
      if (*(int *)(*(long *)(__ptr + 0xc2e) + 4) <= lVar18) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar26 = *(long *)(*(long *)(__ptr + 0xc2e) + 8);
      lVar16 = (long)*(int *)(lVar26 + -4 + lVar23);
      if (lVar16 < 1) {
        __assert_fail("Vec_IntSize(vArray) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                      ,0x194,"int Maj_ManAddCnfStart(Maj_Man_t *)");
      }
      begin = *(lit **)(lVar26 + lVar23);
      iVar3 = sat_solver_addclause(*(sat_solver **)(__ptr + 0xc30),begin,begin + lVar16);
      if (iVar3 == 0) {
LAB_005a60ca:
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                      ,0x1d4,"int Maj_ManExactSynthesis2(int, int, int, int, int, int, int)");
      }
      lVar18 = lVar18 + 1;
      lVar23 = lVar23 + 0x10;
    } while (lVar18 < (long)(int)__ptr[2] + -1);
  }
  if (fVerbose != 0) {
    printf("Running exact synthesis for %d-input majority with %d MAJ3 gates...\n",(ulong)*__ptr,
           (ulong)__ptr[1]);
  }
  if (local_214 == 0xffffffff) {
LAB_005a5d6d:
    if (local_214 == 0xffffffff) {
      printf("Realization of %d-input majority using %d MAJ3 gates:\n",(ulong)*__ptr,(ulong)__ptr[1]
            );
      uVar17 = __ptr[2];
      if ((int)(*__ptr + 2) < (int)uVar17) {
        puVar10 = __ptr + (long)(int)uVar17 * 0x60 + -0x14;
        lVar18 = (long)(int)uVar17;
        do {
          lVar23 = lVar18 + -1;
          printf("%02d = MAJ(",(ulong)((int)lVar18 - 3));
          lVar18 = 2;
          puVar27 = puVar10;
          do {
            iVar3 = 0;
            bVar33 = false;
            uVar29 = 0xffffffff;
            if (0 < (long)(int)__ptr[2]) {
              uVar20 = 0;
              do {
                uVar17 = puVar27[uVar20];
                if ((ulong)uVar17 != 0) {
                  if (((int)uVar17 < 0) || (**(int **)(__ptr + 0xc30) <= (int)uVar17)) {
LAB_005a604e:
                    __assert_fail("v >= 0 && v < s->size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                                  ,0xda,"int sat_solver_var_value(sat_solver *, int)");
                  }
                  bVar33 = *(int *)(*(long *)(*(int **)(__ptr + 0xc30) + 0x52) + (ulong)uVar17 * 4)
                           == 1;
                  if (bVar33) {
                    uVar29 = uVar20 & 0xffffffff;
                  }
                  iVar3 = iVar3 + (uint)bVar33;
                }
                uVar20 = uVar20 + 1;
              } while ((long)(int)__ptr[2] != uVar20);
              bVar33 = iVar3 == 1;
            }
            if (!bVar33) {
LAB_005a60ab:
              __assert_fail("Count == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                            ,0x116,"int Maj_ManFindFanin(Maj_Man_t *, int, int)");
            }
            iVar3 = (int)uVar29;
            if ((iVar3 < 2) || ((int)(*__ptr + 2) <= iVar3)) {
              if (iVar3 < 2) {
                pcVar25 = " %d";
              }
              else {
                uVar29 = (ulong)(iVar3 - 2);
                pcVar25 = " %02d";
              }
            }
            else {
              uVar29 = (ulong)(iVar3 + 0x5f);
              pcVar25 = " %c";
            }
            printf(pcVar25,uVar29);
            puVar27 = puVar27 + -0x20;
            bVar33 = lVar18 != 0;
            lVar18 = lVar18 + -1;
          } while (bVar33);
          puts(" )");
          puVar10 = puVar10 + -0x60;
          lVar18 = lVar23;
        } while ((long)(int)*__ptr + 2 < lVar23);
      }
    }
    sat_solver_delete(*(sat_solver **)(__ptr + 0xc30));
    pvVar11 = *(void **)(__ptr + 10);
    if (*(void **)((long)pvVar11 + 8) != (void *)0x0) {
      free(*(void **)((long)pvVar11 + 8));
      *(undefined8 *)((long)pvVar11 + 8) = 0;
    }
    if (pvVar11 != (void *)0x0) {
      free(pvVar11);
    }
    piVar14 = *(int **)(__ptr + 0xc2e);
    if (0 < *piVar14) {
      lVar18 = 8;
      lVar23 = 0;
      do {
        if (*(void **)(*(long *)(piVar14 + 2) + lVar18) != (void *)0x0) {
          free(*(void **)(*(long *)(piVar14 + 2) + lVar18));
          *(undefined8 *)(*(long *)(piVar14 + 2) + lVar18) = 0;
        }
        lVar23 = lVar23 + 1;
        lVar18 = lVar18 + 0x10;
      } while (lVar23 < *piVar14);
    }
    if (*(void **)(piVar14 + 2) != (void *)0x0) {
      free(*(void **)(piVar14 + 2));
      piVar14[2] = 0;
      piVar14[3] = 0;
    }
    piVar14[0] = 0;
    piVar14[1] = 0;
    free(piVar14);
    free(__ptr);
    iVar4 = 3;
    iVar3 = clock_gettime(3,&local_1b8);
    if (iVar3 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = CONCAT44(local_1b8.tv_nsec._4_4_,(uint)local_1b8.tv_nsec) / 1000 +
               CONCAT44(local_1b8.tv_sec._4_4_,(int)local_1b8.tv_sec) * 1000000;
    }
    lVar18 = lVar18 + local_1d8;
    Abc_Print(iVar4,"%s =","Total runtime");
    Abc_Print(iVar4,"%9.2f sec\n",(double)lVar18 / 1000000.0);
    return (int)(local_214 == 0xffffffff);
  }
  local_1c0 = __ptr + 0xcc;
  uVar17 = 0;
  do {
    iVar3 = clock_gettime(3,&local_1b8);
    if (iVar3 < 0) {
      lVar18 = 1;
    }
    else {
      lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                      SEXT816(CONCAT44(local_1b8.tv_nsec._4_4_,(uint)local_1b8.tv_nsec)),8);
      lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) +
               CONCAT44(local_1b8.tv_sec._4_4_,(int)local_1b8.tv_sec) * -1000000;
    }
    uVar21 = *__ptr;
    iVar3 = 0;
    if (0 < (long)(int)uVar21) {
      uVar15 = 0;
      do {
        iVar3 = iVar3 + (uint)((local_214 >> (uVar15 & 0x1f) & 1) != 0);
        uVar15 = uVar15 + 1;
      } while (uVar21 != uVar15);
    }
    if (0 < (int)uVar21) {
      lVar23 = 0;
      do {
        __ptr[lVar23 + 0xc0e] = (uint)((local_214 >> ((uint)lVar23 & 0x1f) & 1) != 0);
        lVar23 = lVar23 + 1;
      } while ((int)uVar21 != lVar23);
    }
    sat_solver_setnvars(*(sat_solver **)(__ptr + 0xc30),__ptr[1] * 4 + __ptr[4]);
    uVar15 = *__ptr;
    local_1f0 = (uint *)CONCAT44(local_1f0._4_4_,uVar17);
    if ((int)(uVar15 + 2) < (int)__ptr[2]) {
      uVar29 = (long)(int)uVar15 + 2;
      uVar15 = uVar15 * 8;
      local_1dc = (uint)((int)uVar21 / 2 < iVar3);
      local_1d0 = lVar18;
      do {
        local_1c8 = (ulong)uVar15;
        uVar17 = (__ptr[4] + ((int)uVar29 - *__ptr) * 4) - 8;
        local_210 = (uint *)(ulong)uVar17;
        local_1f8 = (ulong)(int)uVar17;
        iVar3 = uVar15 + __ptr[4] * 2 + *__ptr * -8;
        local_228 = 0;
        local_208 = uVar29;
        do {
          if (0 < (int)__ptr[2]) {
            lVar18 = local_228 + local_1f8;
            iVar4 = -10;
            lVar23 = 0;
            do {
              if (local_1e8[local_228 * 0x20 + uVar29 * 0x60 + lVar23] != 0) {
                puVar10 = local_1e8 + local_228 * 0x20 + uVar29 * 0x60 + lVar23;
                uVar17 = *__ptr;
                uVar21 = __ptr[4];
                uVar15 = 0;
                do {
                  if (((int)*puVar10 < 0) || (local_1b8.tv_sec._0_4_ = *puVar10 * 2 + 1, lVar18 < 0)
                     ) goto LAB_005a602f;
                  local_1b8.tv_sec._4_4_ = iVar3 + uVar15;
                  if (lVar23 + -2 < (long)(int)*__ptr) {
                    bVar34 = 0x10;
                    end = &local_1b8.tv_nsec;
                    if (uVar15 != __ptr[lVar23 + 0xc0c]) goto LAB_005a57de;
                  }
                  else {
                    if ((int)(uVar21 + ((int)lVar23 - uVar17) * 4 + -8) < -3) goto LAB_005a602f;
                    local_1b8.tv_nsec._0_4_ = iVar4 + uVar21 * 2 + uVar17 * -8 + uVar15 ^ 1;
                    end = (long *)((long)&local_1b8.tv_nsec + 4);
LAB_005a57de:
                    iVar6 = sat_solver_addclause
                                      (*(sat_solver **)(__ptr + 0xc30),(lit *)&local_1b8,(lit *)end)
                    ;
                    bVar34 = iVar6 == 0;
                  }
                  if ((bVar34 & 0xf) != 0) goto LAB_005a5812;
                  uVar15 = uVar15 + 1;
                } while (uVar15 == 1);
                bVar34 = 0;
LAB_005a5812:
                if (bVar34 != 0) goto LAB_005a5d54;
              }
              lVar23 = lVar23 + 1;
              iVar4 = iVar4 + 8;
              uVar29 = local_208;
            } while (lVar23 < (int)__ptr[2]);
          }
          local_228 = local_228 + 1;
          iVar3 = iVar3 + 2;
        } while (local_228 != 3);
        iVar3 = (int)local_210;
        local_1f8 = (ulong)(iVar3 * 2 + 6);
        uVar17 = 0;
        do {
          if ((__ptr[2] - 1 != (int)uVar29) || (uVar17 != local_1dc)) {
            iVar4 = (int)local_1f8;
            iVar6 = 3;
            do {
              uVar21 = 0;
              if (iVar6 != 3) {
                if ((int)local_210 < 0) goto LAB_005a602f;
                uVar21 = 1;
                local_1b8.tv_sec._0_4_ = uVar17 + iVar3 * 2;
              }
              if (iVar6 != 2) {
                if ((int)local_210 < -1) goto LAB_005a602f;
                uVar20 = (ulong)uVar21;
                uVar21 = uVar21 + 1;
                *(uint *)((long)&local_1b8.tv_sec + uVar20 * 4) = iVar3 * 2 + 2 + uVar17;
              }
              if (iVar6 != 1) {
                if ((int)local_210 < -2) goto LAB_005a602f;
                uVar20 = (ulong)uVar21;
                uVar21 = uVar21 + 1;
                *(uint *)((long)&local_1b8.tv_sec + uVar20 * 4) = iVar3 * 2 + 4 + uVar17;
              }
              if (__ptr[2] - 1 != (int)uVar29) {
                if ((int)local_210 < -3) goto LAB_005a602f;
                uVar20 = (ulong)uVar21;
                uVar21 = uVar21 + 1;
                *(uint *)((long)&local_1b8.tv_sec + uVar20 * 4) = iVar4 + uVar17 ^ 1;
              }
              if (3 < uVar21) {
                __assert_fail("nLits <= 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                              ,0x1c5,"int Maj_ManAddCnf(Maj_Man_t *, int)");
              }
              iVar22 = sat_solver_addclause
                                 (*(sat_solver **)(__ptr + 0xc30),(lit *)&local_1b8,
                                  (lit *)((long)&local_1b8.tv_sec + (ulong)uVar21 * 4));
              if (iVar22 == 0) goto LAB_005a5d54;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          bVar33 = uVar17 == 0;
          uVar17 = uVar17 + 1;
        } while (bVar33);
        uVar29 = uVar29 + 1;
        uVar15 = (int)local_1c8 + 8;
        lVar18 = local_1d0;
        uVar17 = (uint)local_1f0;
      } while ((long)uVar29 < (long)(int)__ptr[2]);
    }
    __ptr[4] = __ptr[4] + __ptr[1] * 4;
    iVar3 = sat_solver_solve(*(sat_solver **)(__ptr + 0xc30),(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (fVerbose != 0) {
      printf("Iter %3d : ",(ulong)uVar17);
      Extra_PrintBinary(_stdout,&local_214,*__ptr);
      printf("  Var =%5d  ",(ulong)__ptr[4]);
      uVar17 = sat_solver_nclauses(*(sat_solver **)(__ptr + 0xc30));
      printf("Cla =%6d  ",(ulong)uVar17);
      uVar17 = sat_solver_nconflicts(*(sat_solver **)(__ptr + 0xc30));
      printf("Conf =%9d  ",(ulong)uVar17);
      iVar6 = 3;
      iVar4 = clock_gettime(3,&local_1b8);
      if (iVar4 < 0) {
        lVar23 = -1;
      }
      else {
        lVar23 = CONCAT44(local_1b8.tv_nsec._4_4_,(uint)local_1b8.tv_nsec) / 1000 +
                 CONCAT44(local_1b8.tv_sec._4_4_,(int)local_1b8.tv_sec) * 1000000;
      }
      Abc_Print(iVar6,"%s =","Time");
      Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar23 + lVar18) / 1000000.0);
    }
    if (iVar3 == -1) {
LAB_005a5d54:
      printf("The problem has no solution after %2d iterations.  ",(ulong)((uint)local_1f0 + 1));
      goto LAB_005a5d6d;
    }
    uVar17 = *__ptr;
    uVar21 = __ptr[2];
    if ((int)(uVar17 + 2) < (int)uVar21) {
      lVar18 = (long)(int)uVar17 + 2;
      puVar10 = local_1c0 + (long)(int)uVar17 * 0x60;
      do {
        lVar23 = 0;
        puVar27 = puVar10;
        do {
          iVar4 = 0;
          bVar33 = false;
          uVar29 = 0xffffffff;
          iVar3 = -1;
          if (0 < (int)uVar21) {
            uVar20 = 0;
            do {
              uVar15 = puVar27[uVar20];
              if ((ulong)uVar15 != 0) {
                if (((int)uVar15 < 0) || (**(int **)(__ptr + 0xc30) <= (int)uVar15))
                goto LAB_005a604e;
                bVar33 = *(int *)(*(long *)(*(int **)(__ptr + 0xc30) + 0x52) + (ulong)uVar15 * 4) ==
                         1;
                if (bVar33) {
                  uVar29 = uVar20 & 0xffffffff;
                }
                iVar4 = iVar4 + (uint)bVar33;
              }
              iVar3 = (int)uVar29;
              uVar20 = uVar20 + 1;
            } while (uVar21 != uVar20);
            bVar33 = iVar4 == 1;
          }
          if (!bVar33) goto LAB_005a60ab;
          uVar15 = __ptr[3];
          uVar5 = iVar3 * uVar15;
          if ((int)uVar5 < 0) goto LAB_005a606d;
          iVar3 = *(int *)(*(long *)(__ptr + 10) + 4);
          if (iVar3 <= (int)uVar5) goto LAB_005a606d;
          lVar26 = *(long *)(*(long *)(__ptr + 10) + 8);
          (&local_1b8.tv_sec)[lVar23] = lVar26 + (ulong)uVar5 * 8;
          lVar23 = lVar23 + 1;
          puVar27 = puVar27 + 0x20;
        } while (lVar23 != 3);
        iVar4 = (int)lVar18 * uVar15;
        if ((iVar4 < 0) || (iVar3 <= iVar4)) goto LAB_005a606d;
        if (0 < (int)uVar15) {
          uVar29 = 0;
          do {
            uVar20 = *(ulong *)(CONCAT44(local_1b8.tv_nsec._4_4_,(uint)local_1b8.tv_nsec) +
                               uVar29 * 8);
            uVar13 = *(ulong *)(local_1a8 + uVar29 * 8);
            *(ulong *)(lVar26 + (ulong)((int)lVar18 * uVar15) * 8 + uVar29 * 8) =
                 uVar13 & uVar20 |
                 (uVar13 | uVar20) &
                 *(ulong *)(CONCAT44(local_1b8.tv_sec._4_4_,(int)local_1b8.tv_sec) + uVar29 * 8);
            uVar29 = uVar29 + 1;
          } while (uVar15 != uVar29);
        }
        lVar18 = lVar18 + 1;
        puVar10 = puVar10 + 0x60;
      } while (uVar21 != (uint)lVar18);
    }
    iVar3 = 1 << ((byte)uVar17 & 0x1f);
    uVar29 = 0xffffffff;
    uVar15 = 0xffffffff;
    if (uVar17 != 0x1f) {
      iVar4 = 1;
      if (1 < iVar3) {
        iVar4 = iVar3;
      }
      uVar20 = 0;
      do {
        iVar6 = (int)uVar20;
        bVar33 = false;
        if (((int)uVar17 / 2 <= Abc_TtBitCount8[uVar20 >> 8] + Abc_TtBitCount8[uVar20 & 0xff]) &&
           (Abc_TtBitCount8[uVar20 >> 8] + Abc_TtBitCount8[uVar20 & 0xff] <= (int)uVar17 / 2 + 1)) {
          uVar15 = __ptr[3] * uVar21;
          if ((int)uVar15 < 0) goto LAB_005a606d;
          iVar22 = *(int *)(*(long *)(__ptr + 10) + 4);
          if (((iVar22 <= (int)uVar15) || (uVar5 = __ptr[3] * (uVar21 - 1), (int)uVar5 < 0)) ||
             (iVar22 <= (int)uVar5)) goto LAB_005a606d;
          lVar18 = *(long *)(*(long *)(__ptr + 10) + 8);
          bVar33 = ((*(ulong *)(lVar18 + (ulong)uVar5 * 8 + (uVar20 >> 6) * 8) ^
                    *(ulong *)(lVar18 + (ulong)uVar15 * 8 + (uVar20 >> 6) * 8)) >> (uVar20 & 0x3f) &
                   1) != 0;
          if (bVar33) {
            uVar29 = uVar20;
          }
        }
        uVar15 = (uint)uVar29;
      } while ((!bVar33) && (uVar20 = (ulong)(iVar6 + 1), iVar4 + -1 != iVar6));
    }
    if (iVar3 <= (int)uVar15) {
      __assert_fail("iMint < (1 << p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                    ,0x13a,"int Maj_ManEval(Maj_Man_t *)");
    }
    uVar17 = (uint)local_1f0 + 1;
    local_214 = uVar15;
    if (uVar15 == 0xffffffff) goto LAB_005a5d6d;
  } while( true );
LAB_005a53a5:
  iVar3 = 1;
LAB_005a53bb:
  if ((iVar3 != 7) && (iVar3 != 0)) goto LAB_005a60ca;
  lVar18 = lVar18 + 1;
  puVar10 = puVar10 + 0x20;
  puVar31 = puVar31 + 0x20;
  if (lVar18 == 3) goto LAB_005a54f3;
  goto LAB_005a5277;
LAB_005a54f3:
  local_208 = local_208 + 1;
  puVar10 = local_1f0 + 0x60;
  puVar27 = puVar27 + 0x60;
  if ((long)(int)__ptr[2] <= (long)local_208) goto LAB_005a551d;
  goto LAB_005a5267;
}

Assistant:

int Maj_ManExactSynthesis2( int nVars, int nNodes, int fUseConst, int fUseLine, int fUseRand, int nRands, int fVerbose )
{
    int i, iMint = 0;
    abctime clkTotal = Abc_Clock();
    Maj_Man_t * p = Maj_ManAlloc( nVars, nNodes, fUseConst, fUseLine, fUseRand, nRands, fVerbose );
    int status = Maj_ManAddCnfStart( p );
    assert( status );
    if ( fVerbose )
    printf( "Running exact synthesis for %d-input majority with %d MAJ3 gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Maj_ManAddCnf( p, iMint ) )
        {
            printf( "The problem has no solution after %2d iterations.  ", i+1 );
            break;
        }
        status = sat_solver_solve( p->pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", sat_solver_nclauses(p->pSat) );
            printf( "Conf =%9d  ", sat_solver_nconflicts(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == l_False )
        {
            printf( "The problem has no solution after %2d iterations.  ", i+1 );
            break;
        }
        iMint = Maj_ManEval( p );
    }
    if ( iMint == -1 )
        Maj_ManPrintSolution( p );
    Maj_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return iMint == -1;
}